

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O3

SRC_ERROR sinc_mono_vari_process(SRC_STATE *state,SRC_DATA *data)

{
  float fVar1;
  SINC_FILTER *filter;
  undefined1 auVar2 [16];
  SRC_ERROR SVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  int half_filter_chan_len;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  double dVar18;
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  
  filter = (SINC_FILTER *)state->private_data;
  if (filter == (SINC_FILTER *)0x0) {
    SVar3 = SRC_ERR_NO_PRIVATE;
  }
  else {
    iVar10 = state->channels;
    lVar13 = (long)iVar10;
    filter->in_count = data->input_frames * lVar13;
    lVar14 = data->output_frames * lVar13;
    filter->out_count = lVar14;
    filter->out_gen = 0;
    filter->in_used = 0;
    dVar21 = state->last_ratio;
    SVar3 = SRC_ERR_BAD_INTERNAL_STATE;
    if ((0.00390625 <= dVar21) && (dVar21 <= 256.0)) {
      dVar18 = dVar21;
      if (data->src_ratio <= dVar21) {
        dVar18 = data->src_ratio;
      }
      dVar20 = state->last_position;
      dVar23 = dVar20 - (double)(int)ROUND(dVar20);
      dVar23 = (double)(~-(ulong)(dVar23 < 0.0) & (ulong)dVar23 |
                       (ulong)(dVar23 + 1.0) & -(ulong)(dVar23 < 0.0));
      auVar25._8_8_ = 0;
      auVar25._0_8_ = dVar23;
      iVar11 = filter->b_len;
      lVar8 = (long)((int)ROUND(dVar20 - dVar23) * iVar10 + filter->b_current) % (long)iVar11;
      filter->b_current = (int)lVar8;
      if (lVar14 < 1) {
        lVar8 = 0;
        lVar14 = 0;
      }
      else {
        dVar20 = ((double)filter->coeff_half_len + 2.0) / (double)filter->index_inc;
        half_filter_chan_len =
             ((int)ROUND((double)(-(ulong)(dVar18 < 1.0) & (ulong)(dVar20 / dVar18) |
                                 ~-(ulong)(dVar18 < 1.0) & (ulong)dVar20)) + 1) * iVar10;
        dVar18 = 1.0 / dVar21;
        iVar12 = filter->b_end;
        do {
          iVar7 = (int)lVar8;
          dVar23 = auVar25._0_8_;
          if (((iVar12 - iVar7) + iVar11) % iVar11 <= half_filter_chan_len) {
            SVar3 = prepare_data(filter,iVar10,data,half_filter_chan_len);
            state->error = SVar3;
            if (SVar3 != SRC_ERR_NO_ERROR) {
              return SVar3;
            }
            iVar7 = filter->b_current;
            iVar12 = filter->b_end;
            iVar11 = filter->b_len;
            if (((iVar12 - iVar7) + iVar11) % iVar11 <= half_filter_chan_len) break;
          }
          if ((-1 < filter->b_real_end) &&
             ((double)filter->b_real_end < (double)iVar7 + dVar23 + dVar18 + 1e-20)) break;
          lVar13 = filter->out_count;
          if (0 < lVar13) {
            dVar20 = state->last_ratio;
            if (1e-10 < ABS(dVar20 - data->src_ratio)) {
              dVar21 = ((data->src_ratio - dVar20) * (double)filter->out_gen) / (double)lVar13 +
                       dVar20;
            }
          }
          dVar20 = dVar21;
          if (1.0 <= dVar21) {
            dVar20 = 1.0;
          }
          dVar20 = dVar20 * (double)filter->index_inc;
          uVar15 = (uint)ROUND(dVar20 * 4096.0);
          iVar17 = (int)ROUND(dVar23 * dVar20 * 4096.0);
          iVar10 = filter->coeff_half_len;
          iVar4 = (iVar10 * 0x1000 - iVar17) / (int)uVar15;
          uVar16 = iVar4 * uVar15 + iVar17;
          uVar9 = iVar7 - iVar4;
          if ((int)uVar9 < 0) {
            if (((int)uVar15 < 1) || ((int)uVar16 < 0)) {
              __assert_fail("divident >= 0 && divisor > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0xa0,"int int_div_ceil(int, int)");
            }
            uVar5 = ((uVar15 + uVar16) - 1) / uVar15;
            if (SBORROW4(uVar5,-uVar9) != (int)(uVar5 + uVar9) < 0) {
              __assert_fail("steps <= int_div_ceil (filter_index, increment)",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0x184,
                            "double calc_output_single(SINC_FILTER *, increment_t, increment_t)");
            }
            uVar16 = uVar9 * uVar15 + uVar16;
            uVar9 = 0;
          }
          dVar22 = 0.0;
          dVar24 = 0.0;
          if (-1 < (int)uVar16) {
            uVar6 = (ulong)uVar9;
            dVar24 = 0.0;
            do {
              uVar9 = uVar16 >> 0xc;
              if (iVar10 < (int)uVar9) {
                __assert_fail("indx >= 0 && indx + 1 < filter->coeff_half_len + 2",
                              "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                              ,0x18c,
                              "double calc_output_single(SINC_FILTER *, increment_t, increment_t)");
              }
              if ((long)iVar11 <= (long)uVar6) {
                __assert_fail("data_index >= 0 && data_index < filter->b_len",
                              "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                              ,0x18e,
                              "double calc_output_single(SINC_FILTER *, increment_t, increment_t)");
              }
              if ((long)iVar12 <= (long)uVar6) {
                __assert_fail("data_index < filter->b_end",
                              "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                              ,399,
                              "double calc_output_single(SINC_FILTER *, increment_t, increment_t)");
              }
              fVar1 = filter->coeffs[uVar9];
              dVar24 = dVar24 + (double)filter->buffer[uVar6] *
                                ((double)(uVar16 & 0xfff) * 0.000244140625 *
                                 (double)(filter->coeffs[(ulong)uVar9 + 1] - fVar1) + (double)fVar1)
              ;
              uVar6 = uVar6 + 1;
              uVar16 = uVar16 - uVar15;
            } while (-1 < (int)uVar16);
          }
          iVar4 = (int)(iVar10 * 0x1000 - (uVar15 - iVar17)) / (int)uVar15;
          uVar9 = iVar7 + iVar4 + 1;
          uVar16 = iVar4 * uVar15 + (uVar15 - iVar17);
          do {
            iVar4 = (int)uVar16 >> 0xc;
            if (iVar10 + 2 <= iVar4) {
              __assert_fail("indx < filter->coeff_half_len + 2",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0x1a0,
                            "double calc_output_single(SINC_FILTER *, increment_t, increment_t)");
            }
            if (((int)uVar9 < 0) || (iVar11 <= (int)uVar9)) {
              __assert_fail("data_index >= 0 && data_index < filter->b_len",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0x1a2,
                            "double calc_output_single(SINC_FILTER *, increment_t, increment_t)");
            }
            if (iVar12 <= (int)uVar9) {
              __assert_fail("data_index < filter->b_end",
                            "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                            ,0x1a3,
                            "double calc_output_single(SINC_FILTER *, increment_t, increment_t)");
            }
            fVar1 = filter->coeffs[iVar4];
            dVar22 = dVar22 + (double)filter->buffer[uVar9] *
                              ((double)(uVar16 & 0xfff) * 0.000244140625 *
                               (double)(filter->coeffs[(long)iVar4 + 1] - fVar1) + (double)fVar1);
            uVar16 = uVar16 - uVar15;
            uVar9 = uVar9 - 1;
          } while (0 < (int)uVar16);
          lVar14 = filter->out_gen;
          data->data_out[lVar14] = (float)((dVar20 / (double)filter->index_inc) * (dVar24 + dVar22))
          ;
          lVar14 = lVar14 + 1;
          filter->out_gen = lVar14;
          dVar24 = dVar23 + 1.0 / dVar21;
          dVar20 = dVar24 - (double)(int)ROUND(dVar24);
          auVar19._0_8_ = ~-(ulong)(dVar20 < 0.0) & (ulong)dVar20;
          auVar19._8_8_ = 0;
          auVar2._8_4_ = auVar25._8_4_;
          auVar2._0_8_ = (ulong)(dVar20 + 1.0) & -(ulong)(dVar20 < 0.0);
          auVar2._12_4_ = auVar25._12_4_;
          auVar25 = auVar19 | auVar2;
          iVar10 = state->channels;
          dVar23 = auVar25._0_8_;
          lVar8 = (long)((int)ROUND(dVar24 - dVar23) * iVar10 + iVar7) % (long)iVar11;
          filter->b_current = (int)lVar8;
        } while (lVar14 < lVar13);
        lVar14 = filter->in_used;
        lVar8 = filter->out_gen;
        lVar13 = (long)state->channels;
      }
      state->last_position = dVar23;
      state->last_ratio = dVar21;
      data->input_frames_used = lVar14 / lVar13;
      data->output_frames_gen = lVar8 / lVar13;
      SVar3 = SRC_ERR_NO_ERROR;
    }
  }
  return SVar3;
}

Assistant:

static SRC_ERROR
sinc_mono_vari_process (SRC_STATE *state, SRC_DATA *data)
{	SINC_FILTER *filter ;
	double		input_index, src_ratio, count, float_increment, terminate, rem ;
	increment_t	increment, start_filter_index ;
	int			half_filter_chan_len, samples_in_hand ;

	if (state->private_data == NULL)
		return SRC_ERR_NO_PRIVATE ;

	filter = (SINC_FILTER*) state->private_data ;

	/* If there is not a problem, this will be optimised out. */
	if (sizeof (filter->buffer [0]) != sizeof (data->data_in [0]))
		return SRC_ERR_SIZE_INCOMPATIBILITY ;

	filter->in_count = data->input_frames * state->channels ;
	filter->out_count = data->output_frames * state->channels ;
	filter->in_used = filter->out_gen = 0 ;

	src_ratio = state->last_ratio ;

	if (is_bad_src_ratio (src_ratio))
		return SRC_ERR_BAD_INTERNAL_STATE ;

	/* Check the sample rate ratio wrt the buffer len. */
	count = (filter->coeff_half_len + 2.0) / filter->index_inc ;
	if (MIN (state->last_ratio, data->src_ratio) < 1.0)
		count /= MIN (state->last_ratio, data->src_ratio) ;

	/* Maximum coefficientson either side of center point. */
	half_filter_chan_len = state->channels * (int) (psf_lrint (count) + 1) ;

	input_index = state->last_position ;

	rem = fmod_one (input_index) ;
	filter->b_current = (filter->b_current + state->channels * psf_lrint (input_index - rem)) % filter->b_len ;
	input_index = rem ;

	terminate = 1.0 / src_ratio + 1e-20 ;

	/* Main processing loop. */
	while (filter->out_gen < filter->out_count)
	{
		/* Need to reload buffer? */
		samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;

		if (samples_in_hand <= half_filter_chan_len)
		{	if ((state->error = prepare_data (filter, state->channels, data, half_filter_chan_len)) != 0)
				return state->error ;

			samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;
			if (samples_in_hand <= half_filter_chan_len)
				break ;
			} ;

		/* This is the termination condition. */
		if (filter->b_real_end >= 0)
		{	if (filter->b_current + input_index + terminate > filter->b_real_end)
				break ;
			} ;

		if (filter->out_count > 0 && fabs (state->last_ratio - data->src_ratio) > 1e-10)
			src_ratio = state->last_ratio + filter->out_gen * (data->src_ratio - state->last_ratio) / filter->out_count ;

		float_increment = filter->index_inc * (src_ratio < 1.0 ? src_ratio : 1.0) ;
		increment = double_to_fp (float_increment) ;

		start_filter_index = double_to_fp (input_index * float_increment) ;

		data->data_out [filter->out_gen] = (float) ((float_increment / filter->index_inc) *
										calc_output_single (filter, increment, start_filter_index)) ;
		filter->out_gen ++ ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		rem = fmod_one (input_index) ;

		filter->b_current = (filter->b_current + state->channels * psf_lrint (input_index - rem)) % filter->b_len ;
		input_index = rem ;
		} ;

	state->last_position = input_index ;

	/* Save current ratio rather then target ratio. */
	state->last_ratio = src_ratio ;

	data->input_frames_used = filter->in_used / state->channels ;
	data->output_frames_gen = filter->out_gen / state->channels ;

	return SRC_ERR_NO_ERROR ;
}